

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_relational_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue val;
  JSValue val_00;
  int iVar1;
  int in_EDX;
  JSContext *in_RSI;
  undefined8 in_RDI;
  bool bVar2;
  JSValue JVar3;
  JSValue JVar4;
  double d2;
  double d1;
  JSString *p2;
  JSString *p1;
  int res;
  JSValue op2;
  JSValue op1;
  JSContext *in_stack_ffffffffffffff20;
  JSContext *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  int64_t in_stack_ffffffffffffff38;
  uint uStack_bc;
  double local_a0;
  double local_98;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_c;
  
  JVar3.tag._0_4_ = in_stack_ffffffffffffffe0;
  JVar3.u.ptr = (void *)in_RDI;
  JVar3.tag._4_4_ = in_stack_ffffffffffffffe4;
  JVar3 = JS_ToPrimitiveFree(in_RSI,JVar3,in_EDX);
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    JVar4.tag._0_4_ = in_stack_ffffffffffffffe0;
    JVar4.u.ptr = (void *)in_RDI;
    JVar4.tag._4_4_ = in_stack_ffffffffffffffe4;
    JVar4 = JS_ToPrimitiveFree(in_RSI,JVar4,in_EDX);
    iVar1 = JS_IsException(JVar4);
    if (iVar1 == 0) {
      if (((int)JVar3.tag == -7) && ((int)JVar4.tag == -7)) {
        iVar1 = js_string_compare((JSContext *)
                                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                  (JSString *)in_stack_ffffffffffffff28,
                                  (JSString *)in_stack_ffffffffffffff20);
        v_01.tag._0_4_ = in_stack_ffffffffffffff30;
        v_01.u.ptr = in_stack_ffffffffffffff28;
        v_01.tag._4_4_ = in_stack_ffffffffffffff34;
        JS_FreeValue(in_stack_ffffffffffffff20,v_01);
        v_02.tag._0_4_ = in_stack_ffffffffffffff30;
        v_02.u.ptr = in_stack_ffffffffffffff28;
        v_02.tag._4_4_ = in_stack_ffffffffffffff34;
        JS_FreeValue(in_stack_ffffffffffffff20,v_02);
        switch(in_EDX) {
        case 0xa3:
          bVar2 = iVar1 < 0;
          break;
        case 0xa4:
          bVar2 = iVar1 < 1;
          break;
        case 0xa5:
          bVar2 = 0 < iVar1;
          break;
        default:
          bVar2 = -1 < iVar1;
        }
LAB_001632e2:
        in_RSI[-1].loaded_modules.next = (list_head *)CONCAT44(uStack_c,(uint)bVar2);
        in_RSI[-1].compile_regexp = (_func_JSValue_JSContext_ptr_JSValue_JSValue *)0x1;
        return 0;
      }
      val.u._4_4_ = in_stack_ffffffffffffff34;
      val.u.int32 = in_stack_ffffffffffffff30;
      val.tag = in_stack_ffffffffffffff38;
      iVar1 = JS_ToFloat64Free(in_stack_ffffffffffffff28,(double *)in_stack_ffffffffffffff20,val);
      if (iVar1 == 0) {
        val_00.u._4_4_ = in_stack_ffffffffffffff34;
        val_00.u.int32 = in_stack_ffffffffffffff30;
        val_00.tag = in_stack_ffffffffffffff38;
        iVar1 = JS_ToFloat64Free(in_stack_ffffffffffffff28,(double *)in_stack_ffffffffffffff20,
                                 val_00);
        if (iVar1 == 0) {
          switch(in_EDX) {
          case 0xa3:
            bVar2 = local_98 < local_a0;
            break;
          case 0xa4:
            bVar2 = local_98 <= local_a0;
            break;
          case 0xa5:
            bVar2 = local_a0 < local_98;
            break;
          default:
            bVar2 = local_a0 <= local_98;
          }
          goto LAB_001632e2;
        }
      }
      else {
        v_03.tag._0_4_ = in_stack_ffffffffffffff30;
        v_03.u.ptr = in_stack_ffffffffffffff28;
        v_03.tag._4_4_ = in_stack_ffffffffffffff34;
        JS_FreeValue(in_stack_ffffffffffffff20,v_03);
      }
    }
    else {
      v_00.tag._0_4_ = in_stack_ffffffffffffff30;
      v_00.u.ptr = in_stack_ffffffffffffff28;
      v_00.tag._4_4_ = in_stack_ffffffffffffff34;
      JS_FreeValue(in_stack_ffffffffffffff20,v_00);
    }
  }
  else {
    v.tag._0_4_ = in_stack_ffffffffffffff30;
    v.u.ptr = in_stack_ffffffffffffff28;
    v.tag._4_4_ = in_stack_ffffffffffffff34;
    JS_FreeValue(in_stack_ffffffffffffff20,v);
  }
  in_RSI[-1].loaded_modules.next = (list_head *)((ulong)uStack_bc << 0x20);
  in_RSI[-1].compile_regexp = (_func_JSValue_JSContext_ptr_JSValue_JSValue *)0x3;
  in_RSI[-1].eval_internal =
       (_func_JSValue_JSContext_ptr_JSValue_char_ptr_size_t_char_ptr_int_int *)
       ((ulong)in_stack_ffffffffffffff34 << 0x20);
  in_RSI[-1].user_opaque = (void *)0x3;
  return -1;
}

Assistant:

static no_inline int js_relational_slow(JSContext *ctx, JSValue *sp,
                                        OPCodeEnum op)
{
    JSValue op1, op2;
    int res;

    op1 = sp[-2];
    op2 = sp[-1];
    op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NUMBER);
    if (JS_IsException(op1)) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NUMBER);
    if (JS_IsException(op2)) {
        JS_FreeValue(ctx, op1);
        goto exception;
    }
    if (JS_VALUE_GET_TAG(op1) == JS_TAG_STRING &&
        JS_VALUE_GET_TAG(op2) == JS_TAG_STRING) {
        JSString *p1, *p2;
        p1 = JS_VALUE_GET_STRING(op1);
        p2 = JS_VALUE_GET_STRING(op2);
        res = js_string_compare(ctx, p1, p2);
        JS_FreeValue(ctx, op1);
        JS_FreeValue(ctx, op2);
        switch(op) {
        case OP_lt:
            res = (res < 0);
            break;
        case OP_lte:
            res = (res <= 0);
            break;
        case OP_gt:
            res = (res > 0);
            break;
        default:
        case OP_gte:
            res = (res >= 0);
            break;
        }
    } else {
        double d1, d2;
        if (JS_ToFloat64Free(ctx, &d1, op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        if (JS_ToFloat64Free(ctx, &d2, op2))
            goto exception;
        switch(op) {
        case OP_lt:
            res = (d1 < d2); /* if NaN return false */
            break;
        case OP_lte:
            res = (d1 <= d2); /* if NaN return false */
            break;
        case OP_gt:
            res = (d1 > d2); /* if NaN return false */
            break;
        default:
        case OP_gte:
            res = (d1 >= d2); /* if NaN return false */
            break;
        }
    }
    sp[-2] = JS_NewBool(ctx, res);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}